

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void getFIRST(void)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  reference pcVar5;
  mapped_type *pmVar6;
  size_type sVar7;
  mapped_type *this;
  reference pbVar8;
  reference pcVar9;
  size_type sVar10;
  mapped_type *pmVar11;
  _Self local_118;
  key_type local_109;
  _Self local_108;
  char local_f9;
  iterator iStack_f8;
  char nonTerminalChar_1;
  iterator __end1;
  iterator __begin1;
  set<char,_std::less<char>,_std::allocator<char>_> *__range1;
  char local_c9;
  iterator iStack_c8;
  char temp;
  iterator __end6;
  iterator __begin6;
  mapped_type *__range6;
  bool flag;
  char local_81;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Stack_80;
  char ch;
  iterator __end4;
  iterator __begin4;
  string *__range4;
  string rightSide;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_48;
  iterator __end3;
  iterator __begin3;
  mapped_type *__range3;
  int firstSize;
  char nonTerminalChar;
  iterator __end2;
  iterator __begin2;
  set<char,_std::less<char>,_std::allocator<char>_> *__range2;
  bool update;
  
  bVar3 = true;
  do {
    if (!bVar3) {
      __end1 = std::set<char,_std::less<char>,_std::allocator<char>_>::begin(&nonTerminalSymbol);
      iStack_f8 = std::set<char,_std::less<char>,_std::allocator<char>_>::end(&nonTerminalSymbol);
      while (bVar3 = std::operator!=(&__end1,&stack0xffffffffffffff08), bVar3) {
        pcVar5 = std::_Rb_tree_const_iterator<char>::operator*(&__end1);
        local_f9 = *pcVar5;
        pmVar6 = std::
                 map<char,_std::set<char,_std::less<char>,_std::allocator<char>_>,_std::less<char>,_std::allocator<std::pair<const_char,_std::set<char,_std::less<char>,_std::allocator<char>_>_>_>_>
                 ::operator[](&FIRST,&local_f9);
        local_109 = '@';
        local_108._M_node =
             (_Base_ptr)
             std::set<char,_std::less<char>,_std::allocator<char>_>::find(pmVar6,&local_109);
        pmVar6 = std::
                 map<char,_std::set<char,_std::less<char>,_std::allocator<char>_>,_std::less<char>,_std::allocator<std::pair<const_char,_std::set<char,_std::less<char>,_std::allocator<char>_>_>_>_>
                 ::operator[](&FIRST,&local_f9);
        local_118._M_node =
             (_Base_ptr)std::set<char,_std::less<char>,_std::allocator<char>_>::end(pmVar6);
        bVar3 = std::operator!=(&local_108,&local_118);
        pmVar11 = std::
                  map<char,_bool,_std::less<char>,_std::allocator<std::pair<const_char,_bool>_>_>::
                  operator[](&toEpsilon,&local_f9);
        *pmVar11 = bVar3;
        std::_Rb_tree_const_iterator<char>::operator++(&__end1);
      }
      return;
    }
    bVar3 = false;
    __end2 = std::set<char,_std::less<char>,_std::allocator<char>_>::begin(&nonTerminalSymbol);
    _firstSize = std::set<char,_std::less<char>,_std::allocator<char>_>::end(&nonTerminalSymbol);
    while (bVar1 = std::operator!=(&__end2,(_Self *)&firstSize), bVar1) {
      pcVar5 = std::_Rb_tree_const_iterator<char>::operator*(&__end2);
      __range3._7_1_ = *pcVar5;
      pmVar6 = std::
               map<char,_std::set<char,_std::less<char>,_std::allocator<char>_>,_std::less<char>,_std::allocator<std::pair<const_char,_std::set<char,_std::less<char>,_std::allocator<char>_>_>_>_>
               ::operator[](&FIRST,(key_type *)((long)&__range3 + 7));
      sVar7 = std::set<char,_std::less<char>,_std::allocator<char>_>::size(pmVar6);
      __range3._0_4_ = (int)sVar7;
      this = std::
             map<char,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<char>,_std::allocator<std::pair<const_char,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
             ::operator[](&GRAMMAR_abi_cxx11_,(key_type *)((long)&__range3 + 7));
      __end3 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::begin(this);
      local_48._M_current =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::end(this);
      while (bVar1 = __gnu_cxx::operator!=(&__end3,&local_48), bVar1) {
        pbVar8 = __gnu_cxx::
                 __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator*(&__end3);
        std::__cxx11::string::string((string *)&__range4,(string *)pbVar8);
        __end4._M_current = (char *)std::__cxx11::string::begin();
        _Stack_80._M_current = (char *)std::__cxx11::string::end();
        while (bVar1 = __gnu_cxx::operator!=(&__end4,&stack0xffffffffffffff80), bVar1) {
          pcVar9 = __gnu_cxx::
                   __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   ::operator*(&__end4);
          local_81 = *pcVar9;
          iVar4 = isupper((int)local_81);
          if (iVar4 == 0) {
            pmVar6 = std::
                     map<char,_std::set<char,_std::less<char>,_std::allocator<char>_>,_std::less<char>,_std::allocator<std::pair<const_char,_std::set<char,_std::less<char>,_std::allocator<char>_>_>_>_>
                     ::operator[](&FIRST,(key_type *)((long)&__range3 + 7));
            std::set<char,_std::less<char>,_std::allocator<char>_>::insert(pmVar6,&local_81);
            break;
          }
          bVar1 = false;
          pmVar6 = std::
                   map<char,_std::set<char,_std::less<char>,_std::allocator<char>_>,_std::less<char>,_std::allocator<std::pair<const_char,_std::set<char,_std::less<char>,_std::allocator<char>_>_>_>_>
                   ::operator[](&FIRST,&local_81);
          __end6 = std::set<char,_std::less<char>,_std::allocator<char>_>::begin(pmVar6);
          iStack_c8 = std::set<char,_std::less<char>,_std::allocator<char>_>::end(pmVar6);
          while (bVar2 = std::operator!=(&__end6,&stack0xffffffffffffff38), bVar2) {
            pcVar5 = std::_Rb_tree_const_iterator<char>::operator*(&__end6);
            local_c9 = *pcVar5;
            if (local_c9 == '@') {
              bVar1 = true;
            }
            pmVar6 = std::
                     map<char,_std::set<char,_std::less<char>,_std::allocator<char>_>,_std::less<char>,_std::allocator<std::pair<const_char,_std::set<char,_std::less<char>,_std::allocator<char>_>_>_>_>
                     ::operator[](&FIRST,(key_type *)((long)&__range3 + 7));
            std::set<char,_std::less<char>,_std::allocator<char>_>::insert(pmVar6,&local_c9);
            std::_Rb_tree_const_iterator<char>::operator++(&__end6);
          }
          if (!bVar1) break;
          __gnu_cxx::
          __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator++(&__end4);
        }
        std::__cxx11::string::~string((string *)&__range4);
        __gnu_cxx::
        __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator++(&__end3);
      }
      sVar7 = (size_type)(int)__range3;
      pmVar6 = std::
               map<char,_std::set<char,_std::less<char>,_std::allocator<char>_>,_std::less<char>,_std::allocator<std::pair<const_char,_std::set<char,_std::less<char>,_std::allocator<char>_>_>_>_>
               ::operator[](&FIRST,(key_type *)((long)&__range3 + 7));
      sVar10 = std::set<char,_std::less<char>,_std::allocator<char>_>::size(pmVar6);
      if (sVar7 != sVar10) {
        bVar3 = true;
      }
      std::_Rb_tree_const_iterator<char>::operator++(&__end2);
    }
  } while( true );
}

Assistant:

void getFIRST() {   //计算 FIRST 集合
    bool update = true;
    while (update) {
        update = false;
        for (char nonTerminalChar : nonTerminalSymbol) { //遍历非终结符
            int firstSize = FIRST[nonTerminalChar].size();
            for (string rightSide : GRAMMAR[nonTerminalChar]) {  //遍历产生式右部
                for (char ch : rightSide) {     //遍历产生式右部所有字符
                    if (!isupper(ch)) {     //如果是终结符
                        FIRST[nonTerminalChar].insert(ch);  //将该终结符加入到 nonTerminalChar 的 First 集合中
                        break;      //退出循环
                    } else {
                        bool flag = false;      //判断 First 集合是否存在空串
                        for (char temp : FIRST[ch]) {   //将 ch 的 First 集合加入到 nonTerminalChar 的 First 集合中
                            if (temp == '@') {
                                flag = true;
                            }
                            FIRST[nonTerminalChar].insert(temp);
                        }
                        if (!flag) {        //如果不存在空串，退出循环
                            break;
                        }
                    }
                }
            }
            if (firstSize != FIRST[nonTerminalChar].size()) {
                update = true;
            }
        }
    }
    for (char nonTerminalChar: nonTerminalSymbol) {
        toEpsilon[nonTerminalChar] = FIRST[nonTerminalChar].find('@') != FIRST[nonTerminalChar].end();
    }
}